

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool rw::writeChunkHeader(Stream *s,int32 type,int32 size)

{
  int32 local_24;
  int32 local_20;
  anon_struct_12_3_2a00130e buf;
  int32 size_local;
  int32 type_local;
  Stream *s_local;
  
  local_24 = type;
  local_20 = size;
  buf.size = size;
  buf.id = type;
  buf.type = libraryIDPack(version,build);
  Stream::write32(s,&local_24,0xc);
  return true;
}

Assistant:

bool
writeChunkHeader(Stream *s, int32 type, int32 size)
{
	struct {
		int32 type, size;
		uint32 id;
	} buf = { type, size, libraryIDPack(version, build) };
	s->write32(&buf, 12);
	return true;
}